

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::postflightKey(Output *this,void *param_1)

{
  undefined8 in_RAX;
  reference pIVar1;
  SmallVector<llvm::yaml::Output::InState,_8U> *this_00;
  InState *Elt;
  undefined8 local_18;
  
  this_00 = &this->StateStack;
  local_18 = in_RAX;
  pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00);
  if (*pIVar1 == inMapFirstKey) {
    SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
              ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)this_00);
    Elt = (InState *)&local_18;
    local_18 = CONCAT44(local_18._4_4_,5);
  }
  else {
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00);
    if (*pIVar1 != inFlowMapFirstKey) {
      return;
    }
    SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
              ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)this_00);
    Elt = (InState *)((long)&local_18 + 4);
    local_18 = CONCAT44(7,(InState)local_18);
  }
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)this_00,Elt);
  return;
}

Assistant:

void Output::postflightKey(void *) {
  if (StateStack.back() == inMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inMapOtherKey);
  } else if (StateStack.back() == inFlowMapFirstKey) {
    StateStack.pop_back();
    StateStack.push_back(inFlowMapOtherKey);
  }
}